

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaPValAttrQName
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaBasicItemPtr ownerItem,
              xmlNodePtr ownerElem,char *name,xmlChar **uri,xmlChar **local)

{
  int iVar1;
  xmlAttrPtr ownerItem_00;
  xmlChar **local_00;
  
  local_00 = uri;
  ownerItem_00 = xmlSchemaGetPropNode((xmlNodePtr)ownerItem,(char *)ownerElem);
  if (ownerItem_00 != (xmlAttrPtr)0x0) {
    iVar1 = xmlSchemaPValAttrNodeQName
                      (ctxt,schema,(xmlSchemaBasicItemPtr)ownerItem_00,(xmlAttrPtr)name,uri,local_00
                      );
    return iVar1;
  }
  *uri = (xmlChar *)0x0;
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  return 0;
}

Assistant:

static int
xmlSchemaPValAttrQName(xmlSchemaParserCtxtPtr ctxt,
				   xmlSchemaPtr schema,
				   xmlSchemaBasicItemPtr ownerItem,
				   xmlNodePtr ownerElem,
				   const char *name,
				   const xmlChar **uri,
				   const xmlChar **local)
{
    xmlAttrPtr attr;

    attr = xmlSchemaGetPropNode(ownerElem, name);
    if (attr == NULL) {
	*local = NULL;
	*uri = NULL;
	return (0);
    }
    return (xmlSchemaPValAttrNodeQName(ctxt, schema,
	ownerItem, attr, uri, local));
}